

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  ColourImpl *pCVar1;
  pointer pSVar2;
  long lVar3;
  ostream *poVar4;
  pointer pSVar5;
  ColourGuard local_48;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo)->name);
  pSVar5 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pSVar5 -
          (long)(this->super_StreamingReporterBase).m_sectionStack.
                super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (1 < (ulong)(lVar3 / 0x30)) {
    pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    local_48.m_code = Headers;
    local_48.m_engaged = true;
    local_48.m_colourImpl = pCVar1;
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1,1,lVar3 % 0x30);
    lineInfo.line = CONCAT35(lineInfo.line._5_3_,0x100000001);
    local_48.m_engaged = false;
    lineInfo.file = (char *)pCVar1;
    ColourImpl::ColourGuard::~ColourGuard(&local_48);
    pSVar5 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar5 = pSVar5 + 1, pSVar5 != pSVar2) {
      printHeaderString(this,&pSVar5->name,2);
    }
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&lineInfo);
    pSVar5 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar5[-1].lineInfo.file;
  lineInfo.line = pSVar5[-1].lineInfo.line;
  poVar4 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  Catch::operator<<(poVar4,(lineOfChars)0x2d);
  poVar4 = std::operator<<(poVar4,'\n');
  local_48.m_colourImpl = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  local_48.m_code = FileName;
  local_48.m_engaged = true;
  (*(local_48.m_colourImpl)->_vptr_ColourImpl[2])(local_48.m_colourImpl,0x17);
  Catch::operator<<(poVar4,&lineInfo);
  poVar4 = std::operator<<(poVar4,'\n');
  Catch::operator<<(poVar4,(lineOfChars)0x2e);
  std::operator<<(poVar4,"\n\n");
  std::ostream::flush();
  ColourImpl::ColourGuard::~ColourGuard(&local_48);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        auto guard = m_colour->guardColour( Colour::Headers ).engage( m_stream );

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;


    m_stream << lineOfChars( '-' ) << '\n'
             << m_colour->guardColour( Colour::FileName ) << lineInfo << '\n'
             << lineOfChars( '.' ) << "\n\n"
             << std::flush;
}